

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareWinAddMissing_rec(Odc_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Odc_Man_t *p_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeIsTravIdPrevious(pObj);
    if ((iVar1 == 0) || (iVar1 = Abc_ObjIsCi(pObj), iVar1 != 0)) {
      Abc_NodeSetTravIdCurrent(pObj);
      Vec_PtrPush(p->vBranches,pObj);
      iVar1 = Vec_PtrSize(p->vBranches);
      p_local._4_4_ = (uint)(iVar1 < 0x21);
    }
    else {
      for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_2c);
        iVar1 = Abc_NtkDontCareWinAddMissing_rec(p,pObj_00);
        if (iVar1 == 0) {
          return 0;
        }
      }
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkDontCareWinAddMissing_rec( Odc_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip the already collected leaves and branches
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 1;
    // if this is not an internal node - make it a new branch
    if ( !Abc_NodeIsTravIdPrevious(pObj) || Abc_ObjIsCi(pObj) ) //|| (int)pObj->Level <= p->nLevLeaves )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        Vec_PtrPush( p->vBranches, pObj );
        return Vec_PtrSize(p->vBranches) <= 32;
    }
    // visit the fanins of the node
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( !Abc_NtkDontCareWinAddMissing_rec( p, pFanin ) )
            return 0;
    return 1;
}